

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_xssqrtqp(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xb)

{
  uint8_t *puVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  float128 arg;
  uintptr_t unaff_retaddr;
  float_status tstat;
  
  (env->fp_status).float_exception_flags = '\0';
  tstat = env->fp_status;
  if ((opcode & 1) != 0) {
    tstat.float_rounding_mode = '\x05';
  }
  tstat.float_exception_flags = '\0';
  arg = float128_sqrt_ppc(xb->f128,&tstat);
  puVar1 = &(env->fp_status).float_exception_flags;
  *puVar1 = *puVar1 | tstat.float_exception_flags;
  if (((ulong)tstat & 0x10000) != 0) {
    iVar5 = float128_is_signaling_nan_ppc(xb->f128,&tstat);
    if (iVar5 == 0) {
      iVar5 = float128_is_quiet_nan_ppc(xb->f128,&tstat);
      if (iVar5 == 0) {
        if ((xb->s64[1] < 0) && ((xb->s64[1] & 0x7fffffffffffffffU) != 0 || xb->u64[0] != 0)) {
          float_invalid_op_vxsqrt(env,true,unaff_retaddr);
          arg = float128_default_nan_ppc(&env->fp_status);
        }
      }
      else {
        arg = xb->f128;
      }
    }
    else {
      pbVar2 = (byte *)((long)&env->fpscr + 3);
      *pbVar2 = *pbVar2 | 1;
      finish_invalid_op_excp(env,5,unaff_retaddr);
      arg.high = xb->u64[1] | 0x800000000000;
      arg.low = xb->u64[0];
    }
  }
  uVar4 = float128_classify(arg);
  uVar3 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  env->fpscr = (uint)(byte)set_fprf_from_class_fprf[(ulong)(uVar4 >> 6) + (ulong)uVar3 * 2] << 0xc |
               env->fpscr & 0xfffe0fff;
  xt->f128 = arg;
  do_float_check_status(env,unaff_retaddr);
  return;
}

Assistant:

void helper_xssqrtqp(CPUPPCState *env, uint32_t opcode,
                     ppc_vsr_t *xt, ppc_vsr_t *xb)
{
    ppc_vsr_t t = { 0 };
    float_status tstat;

    helper_reset_fpstatus(env);

    tstat = env->fp_status;
    if (unlikely(Rc(opcode) != 0)) {
        tstat.float_rounding_mode = float_round_to_odd;
    }

    set_float_exception_flags(0, &tstat);
    t.f128 = float128_sqrt(xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        if (float128_is_signaling_nan(xb->f128, &tstat)) {
            float_invalid_op_vxsnan(env, GETPC());
            t.f128 = float128_snan_to_qnan(xb->f128);
        } else if (float128_is_quiet_nan(xb->f128, &tstat)) {
            t.f128 = xb->f128;
        } else if (float128_is_neg(xb->f128) && !float128_is_zero(xb->f128)) {
            float_invalid_op_vxsqrt(env, 1, GETPC());
            t.f128 = float128_default_nan(&env->fp_status);
        }
    }

    helper_compute_fprf_float128(env, t.f128);
    *xt = t;
    do_float_check_status(env, GETPC());
}